

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

void __thiscall input_mod::input_mod(input_mod *this,DUH *myduh)

{
  int iVar1;
  undefined4 extraout_var;
  float extraout_XMM0_Da;
  DUH *myduh_local;
  input_mod *this_local;
  
  StreamSong::StreamSong(&this->super_StreamSong);
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__input_mod_009f02b8;
  FString::FString(&this->Codec);
  FString::FString(&this->TrackerVersion);
  FString::FString(&this->FormatVersion);
  FCriticalSection::FCriticalSection(&this->crit_sec);
  this->duh = myduh;
  this->sr = (DUH_SIGRENDERER *)0x0;
  this->eof = false;
  iVar1 = FIntCVar::operator_cast_to_int(&mod_interp);
  this->interp = iVar1;
  iVar1 = FIntCVar::operator_cast_to_int(&mod_volramp);
  this->volramp = iVar1;
  this->written = 0;
  this->length = 0.0;
  this->start_order = 0;
  iVar1 = FIntCVar::operator_cast_to_int(&mod_samplerate);
  if (iVar1 == 0) {
    (*GSnd->_vptr_SoundRenderer[10])();
    this->srate = (int)extraout_XMM0_Da;
  }
  else {
    iVar1 = FIntCVar::operator_cast_to_int(&mod_samplerate);
    this->srate = iVar1;
  }
  iVar1 = (*GSnd->_vptr_SoundRenderer[0xb])(GSnd,read,0x8000,8,(ulong)(uint)this->srate);
  (this->super_StreamSong).m_Stream = (SoundStream *)CONCAT44(extraout_var,iVar1);
  this->delta = 65536.0 / (double)this->srate;
  return;
}

Assistant:

input_mod::input_mod(DUH *myduh)
{
	duh = myduh;
	sr = NULL;
	eof = false;
	interp = mod_interp;
	volramp = mod_volramp;
	written = 0;
	length = 0;
	start_order = 0;
	if (mod_samplerate != 0)
	{
		srate = mod_samplerate;
	}
	else
	{
		srate = (int)GSnd->GetOutputRate();
	}
	m_Stream = GSnd->CreateStream(read, 32*1024, SoundStream::Float, srate, this);
	delta = 65536.0 / srate;
}